

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptGeneratorFunction::SetProperty
          (JavascriptGeneratorFunction *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  PropertyId PVar1;
  ScriptContext *this_00;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  JavascriptGeneratorFunction *this_local;
  
  propertyRecord = (PropertyRecord *)info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)value_local,&local_40);
  if ((local_40 == (PropertyRecord *)0x0) ||
     ((PVar1 = PropertyRecord::GetPropertyId(local_40), PVar1 != 0x1cd &&
      (PVar1 = PropertyRecord::GetPropertyId(local_40), PVar1 != 0x1cf)))) {
    this_local._4_4_ =
         JavascriptFunction::SetProperty
                   ((JavascriptFunction *)this,(JavascriptString *)value_local,pvStack_28,
                    info_local._4_4_,(PropertyValueInfo *)propertyRecord);
  }
  else {
    this_local._4_4_ =
         DynamicObject::SetProperty
                   ((DynamicObject *)this,(JavascriptString *)value_local,pvStack_28,
                    info_local._4_4_,(PropertyValueInfo *)propertyRecord);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptGeneratorFunction::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if (propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments)
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::SetProperty(propertyNameString, value, flags, info);
            }
        }

        return JavascriptFunction::SetProperty(propertyNameString, value, flags, info);
    }